

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageAlphaPremultiply(Image *image)

{
  int newFormat;
  Image image_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Color *pCVar5;
  float fVar6;
  undefined8 in_stack_ffffffffffffffd0;
  int local_24;
  int format;
  int i;
  Color *pixels;
  float alpha;
  Image *image_local;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    uVar1 = image->width;
    uVar2 = image->height;
    uVar3 = image->mipmaps;
    uVar4 = image->format;
    image_00.height = uVar4;
    image_00.width = uVar3;
    image_00.data._4_4_ = uVar2;
    image_00.data._0_4_ = uVar1;
    image_00._16_8_ = in_stack_ffffffffffffffd0;
    pCVar5 = LoadImageColors(image_00);
    for (local_24 = 0; local_24 < image->width * image->height; local_24 = local_24 + 1) {
      if (pCVar5[local_24].a == '\0') {
        pCVar5[local_24].r = '\0';
        pCVar5[local_24].g = '\0';
        pCVar5[local_24].b = '\0';
      }
      else if (pCVar5[local_24].a != 0xff) {
        fVar6 = (float)pCVar5[local_24].a / 255.0;
        pCVar5[local_24].r = (uchar)(int)((float)pCVar5[local_24].r * fVar6);
        pCVar5[local_24].g = (uchar)(int)((float)pCVar5[local_24].g * fVar6);
        pCVar5[local_24].b = (uchar)(int)((float)pCVar5[local_24].b * fVar6);
      }
    }
    free(image->data);
    newFormat = image->format;
    image->data = pCVar5;
    image->format = 7;
    ImageFormat(image,newFormat);
  }
  return;
}

Assistant:

void ImageAlphaPremultiply(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    float alpha = 0.0f;
    Color *pixels = LoadImageColors(*image);

    for (int i = 0; i < image->width*image->height; i++)
    {
        if (pixels[i].a == 0)
        {
            pixels[i].r = 0;
            pixels[i].g = 0;
            pixels[i].b = 0;
        }
        else if (pixels[i].a < 255)
        {
            alpha = (float)pixels[i].a/255.0f;
            pixels[i].r = (unsigned char)((float)pixels[i].r*alpha);
            pixels[i].g = (unsigned char)((float)pixels[i].g*alpha);
            pixels[i].b = (unsigned char)((float)pixels[i].b*alpha);
        }
    }

    RL_FREE(image->data);

    int format = image->format;
    image->data = pixels;
    image->format = PIXELFORMAT_UNCOMPRESSED_R8G8B8A8;

    ImageFormat(image, format);
}